

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharedRenderingPerfTests.cpp
# Opt level: O1

void __thiscall
deqp::egl::anon_unknown_0::SharedRenderingPerfCase::deinit(SharedRenderingPerfCase *this)

{
  TestContext *pTVar1;
  pointer puVar2;
  pointer pfVar3;
  pointer puVar4;
  deUint32 dVar5;
  Library *pLVar6;
  pointer ppTVar7;
  pointer ppTVar8;
  long lVar9;
  
  ppTVar7 = (this->m_contexts).
            super__Vector_base<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppTVar8 = (this->m_contexts).
            super__Vector_base<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (0 < (int)((ulong)((long)ppTVar8 - (long)ppTVar7) >> 3)) {
    lVar9 = 0;
    do {
      pTVar1 = ppTVar7[lVar9];
      if (pTVar1 != (TestContext *)0x0) {
        pLVar6 = EglTestContext::getLibrary(pTVar1->m_testCtx);
        (*pLVar6->_vptr_Library[0x27])
                  (pLVar6,pTVar1->m_eglDisplay,pTVar1->m_eglSurface,pTVar1->m_eglSurface,
                   pTVar1->m_eglContext);
        dVar5 = (*pLVar6->_vptr_Library[0x1f])(pLVar6);
        eglu::checkError(dVar5,"makeCurrent(m_eglDisplay, m_eglSurface, m_eglSurface, m_eglContext)"
                         ,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharedRenderingPerfTests.cpp"
                         ,0x285);
        if ((pTVar1->m_parent == (TestContext *)0x0) && (pTVar1->m_eglImage != (EGLImageKHR)0x0)) {
          (*pLVar6->_vptr_Library[0x15])(pLVar6,pTVar1->m_eglDisplay);
          dVar5 = (*pLVar6->_vptr_Library[0x1f])(pLVar6);
          eglu::checkError(dVar5,"destroyImageKHR(m_eglDisplay, m_eglImage)",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharedRenderingPerfTests.cpp"
                           ,0x288);
        }
        (*pLVar6->_vptr_Library[0x27])(pLVar6,pTVar1->m_eglDisplay,0,0,0);
        dVar5 = (*pLVar6->_vptr_Library[0x1f])(pLVar6);
        eglu::checkError(dVar5,
                         "makeCurrent(m_eglDisplay, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT)"
                         ,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharedRenderingPerfTests.cpp"
                         ,0x28a);
        (*pLVar6->_vptr_Library[0x13])(pLVar6,pTVar1->m_eglDisplay,pTVar1->m_eglContext);
        dVar5 = (*pLVar6->_vptr_Library[0x1f])(pLVar6);
        eglu::checkError(dVar5,"destroyContext(m_eglDisplay, m_eglContext)",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharedRenderingPerfTests.cpp"
                         ,0x28b);
        (*pLVar6->_vptr_Library[0x16])(pLVar6,pTVar1->m_eglDisplay,pTVar1->m_eglSurface);
        dVar5 = (*pLVar6->_vptr_Library[0x1f])(pLVar6);
        eglu::checkError(dVar5,"destroySurface(m_eglDisplay, m_eglSurface)",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharedRenderingPerfTests.cpp"
                         ,0x28c);
        puVar2 = (pTVar1->m_indexData).
                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (puVar2 != (pointer)0x0) {
          operator_delete(puVar2,(long)(pTVar1->m_indexData).
                                       super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                 (long)puVar2);
        }
        pfVar3 = (pTVar1->m_coordData).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (pfVar3 != (pointer)0x0) {
          operator_delete(pfVar3,(long)(pTVar1->m_coordData).
                                       super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                       super__Vector_impl_data._M_end_of_storage - (long)pfVar3);
        }
        operator_delete(pTVar1,0x1ad8);
      }
      (this->m_contexts).
      super__Vector_base<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
      ._M_impl.super__Vector_impl_data._M_start[lVar9] = (TestContext *)0x0;
      lVar9 = lVar9 + 1;
      ppTVar7 = (this->m_contexts).
                super__Vector_base<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppTVar8 = (this->m_contexts).
                super__Vector_base<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    } while (lVar9 < (int)((ulong)((long)ppTVar8 - (long)ppTVar7) >> 3));
  }
  if (ppTVar8 != ppTVar7) {
    (this->m_contexts).
    super__Vector_base<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppTVar7;
  }
  puVar4 = (this->m_results).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->m_results).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar4) {
    (this->m_results).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar4;
  }
  if (this->m_display != (EGLDisplay)0x0) {
    pLVar6 = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
    (*pLVar6->_vptr_Library[0x34])(pLVar6,this->m_display);
    this->m_display = (EGLDisplay)0x0;
  }
  return;
}

Assistant:

void SharedRenderingPerfCase::deinit (void)
{
	// Destroy resources and contexts
	for (int threadNdx = 0; threadNdx < (int)m_contexts.size(); threadNdx++)
	{
		delete m_contexts[threadNdx];
		m_contexts[threadNdx] = DE_NULL;
	}

	m_contexts.clear();
	m_results.clear();

	if (m_display != EGL_NO_DISPLAY)
	{
		m_eglTestCtx.getLibrary().terminate(m_display);
		m_display = EGL_NO_DISPLAY;
	}
}